

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_CutCheckDominance(Cut_Cut_t *pDom,Cut_Cut_t *pCut)

{
  uint local_28;
  int local_24;
  int k;
  int i;
  Cut_Cut_t *pCut_local;
  Cut_Cut_t *pDom_local;
  
  local_24 = 0;
  while( true ) {
    if ((int)(*(uint *)pDom >> 0x1c) <= local_24) {
      return 1;
    }
    local_28 = 0;
    while (((int)local_28 < (int)(*(uint *)pCut >> 0x1c) &&
           (*(int *)(&pDom[1].field_0x0 + (long)local_24 * 4) !=
            *(int *)(&pCut[1].field_0x0 + (long)(int)local_28 * 4)))) {
      local_28 = local_28 + 1;
    }
    if (local_28 == *(uint *)pCut >> 0x1c) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static inline int Cut_CutCheckDominance( Cut_Cut_t * pDom, Cut_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nLeaves; i++ )
    {
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            if ( pDom->pLeaves[i] == pCut->pLeaves[k] )
                break;
        if ( k == (int)pCut->nLeaves ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}